

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<Replace>::Inserter::insertOne(Inserter *this,qsizetype pos,Replace *t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Replace *pRVar3;
  qsizetype qVar4;
  Replace *pRVar5;
  undefined8 uVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  
  pRVar3 = this->begin;
  lVar11 = this->size;
  pRVar5 = pRVar3 + lVar11;
  this->end = pRVar5;
  this->last = pRVar3 + lVar11 + -1;
  this->where = pRVar3 + pos;
  lVar11 = lVar11 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar11;
  this->sourceCopyAssign = 1;
  if (0 < lVar11) {
    pDVar7 = pRVar5[-1].in.d.d;
    pcVar8 = pRVar5[-1].in.d.ptr;
    pRVar5[-1].in.d.d = (Data *)0x0;
    pRVar5[-1].in.d.ptr = (char16_t *)0x0;
    (pRVar5->in).d.d = pDVar7;
    (pRVar5->in).d.ptr = pcVar8;
    qVar4 = pRVar5[-1].in.d.size;
    pRVar5[-1].in.d.size = 0;
    (pRVar5->in).d.size = qVar4;
    pDVar7 = pRVar5[-1].out.d.d;
    pcVar8 = pRVar5[-1].out.d.ptr;
    pRVar5[-1].out.d.d = (Data *)0x0;
    pRVar5[-1].out.d.ptr = (char16_t *)0x0;
    (pRVar5->out).d.d = pDVar7;
    (pRVar5->out).d.ptr = pcVar8;
    qVar4 = pRVar5[-1].out.d.size;
    pRVar5[-1].out.d.size = 0;
    (pRVar5->out).d.size = qVar4;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar11 = 0;
      lVar12 = 0;
      do {
        pRVar5 = this->last;
        puVar2 = (undefined8 *)((long)&(pRVar5->in).d.d + lVar11);
        uVar6 = *puVar2;
        uVar9 = puVar2[1];
        puVar1 = (undefined8 *)((long)&pRVar5[-1].in.d.d + lVar11);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pRVar5->in).d.d + lVar11);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        puVar2 = (undefined8 *)((long)&pRVar5[-1].in.d.d + lVar11);
        *puVar2 = uVar6;
        puVar2[1] = uVar9;
        uVar6 = *(undefined8 *)((long)&(pRVar5->in).d.size + lVar11);
        *(undefined8 *)((long)&(pRVar5->in).d.size + lVar11) =
             *(undefined8 *)((long)pRVar5 + lVar11 + -0x20);
        *(undefined8 *)((long)pRVar5 + lVar11 + -0x20) = uVar6;
        puVar2 = (undefined8 *)((long)&(pRVar5->out).d.d + lVar11);
        uVar6 = *puVar2;
        uVar9 = puVar2[1];
        puVar2 = (undefined8 *)((long)pRVar5 + lVar11 + -0x18);
        uVar10 = puVar2[1];
        puVar1 = (undefined8 *)((long)&(pRVar5->out).d.d + lVar11);
        *puVar1 = *puVar2;
        puVar1[1] = uVar10;
        puVar2 = (undefined8 *)((long)pRVar5 + lVar11 + -0x18);
        *puVar2 = uVar6;
        puVar2[1] = uVar9;
        uVar6 = *(undefined8 *)((long)&(pRVar5->out).d.size + lVar11);
        *(undefined8 *)((long)&(pRVar5->out).d.size + lVar11) =
             *(undefined8 *)((long)pRVar5 + lVar11 + -8);
        *(undefined8 *)((long)pRVar5 + lVar11 + -8) = uVar6;
        lVar12 = lVar12 + -1;
        lVar11 = lVar11 + -0x30;
      } while (lVar12 != this->move);
    }
    pRVar5 = this->where;
    pDVar7 = (pRVar5->in).d.d;
    (pRVar5->in).d.d = (t->in).d.d;
    (t->in).d.d = pDVar7;
    pcVar8 = (pRVar5->in).d.ptr;
    (pRVar5->in).d.ptr = (t->in).d.ptr;
    (t->in).d.ptr = pcVar8;
    qVar4 = (pRVar5->in).d.size;
    (pRVar5->in).d.size = (t->in).d.size;
    (t->in).d.size = qVar4;
    pDVar7 = (pRVar5->out).d.d;
    (pRVar5->out).d.d = (t->out).d.d;
    (t->out).d.d = pDVar7;
    pcVar8 = (pRVar5->out).d.ptr;
    (pRVar5->out).d.ptr = (t->out).d.ptr;
    (t->out).d.ptr = pcVar8;
    qVar4 = (pRVar5->out).d.size;
    (pRVar5->out).d.size = (t->out).d.size;
    (t->out).d.size = qVar4;
    return;
  }
  this->sourceCopyConstruct = 1 - lVar11;
  this->move = 0;
  this->sourceCopyAssign = lVar11;
  pDVar7 = (t->in).d.d;
  (t->in).d.d = (Data *)0x0;
  (pRVar5->in).d.d = pDVar7;
  pcVar8 = (t->in).d.ptr;
  (t->in).d.ptr = (char16_t *)0x0;
  (pRVar5->in).d.ptr = pcVar8;
  qVar4 = (t->in).d.size;
  (t->in).d.size = 0;
  (pRVar5->in).d.size = qVar4;
  pDVar7 = (t->out).d.d;
  (t->out).d.d = (Data *)0x0;
  (pRVar5->out).d.d = pDVar7;
  pcVar8 = (t->out).d.ptr;
  (t->out).d.ptr = (char16_t *)0x0;
  (pRVar5->out).d.ptr = pcVar8;
  qVar4 = (t->out).d.size;
  (t->out).d.size = 0;
  (pRVar5->out).d.size = qVar4;
  this->size = this->size + 1;
  return;
}

Assistant:

void setup(qsizetype pos, qsizetype n)
        {
            end = begin + size;
            last = end - 1;
            where = begin + pos;
            qsizetype dist = size - pos;
            sourceCopyConstruct = 0;
            nSource = n;
            move = n - dist; // smaller 0
            sourceCopyAssign = n;
            if (n > dist) {
                sourceCopyConstruct = n - dist;
                move = 0;
                sourceCopyAssign -= sourceCopyConstruct;
            }
        }